

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

GetHandle __thiscall adios2::Remote::Read(Remote *this,size_t Start,size_t Size,void *Dest)

{
  allocator local_cc;
  allocator local_cb;
  allocator local_ca;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Core",&local_c9);
  std::__cxx11::string::string((string *)&local_48,"Engine",&local_ca);
  std::__cxx11::string::string((string *)&local_68,"ThrowUp",&local_cb);
  std::__cxx11::string::string((string *)&local_c8,"RemoteRead",&local_cc);
  std::operator+(&local_a8,"Non-overridden function ",&local_c8);
  std::operator+(&local_88,&local_a8," called in Remote");
  helper::Throw<std::invalid_argument>(&local_28,&local_48,&local_68,&local_88,-1);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return (GetHandle)0x0;
}

Assistant:

Remote::GetHandle Remote::Read(size_t Start, size_t Size, void *Dest)
{
    ThrowUp("RemoteRead");
    return (Remote::GetHandle)0;
}